

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O3

value_type_conflict3 * __thiscall
poplar::plain_bonsai_nlm<int>::insert(plain_bonsai_nlm<int> *this,uint64_t pos,char_range *key)

{
  ulong __n;
  uint8_t *puVar1;
  uint8_t *puVar2;
  pointer puVar3;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar4;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var5;
  long lVar6;
  long lVar7;
  
  this->size_ = this->size_ + 1;
  puVar1 = key->begin;
  puVar2 = key->end;
  lVar7 = (long)puVar2 - (long)puVar1;
  __n = lVar7 + 4;
  _Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(__n);
  memset((void *)_Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  puVar3 = (this->ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tVar4.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
        &puVar3[pos]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
  puVar3[pos]._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
       _Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (tVar4.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
    operator_delete__((void *)tVar4.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  _Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[pos]._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
  if (puVar2 != puVar1) {
    puVar1 = key->begin;
    lVar6 = 0;
    do {
      *(uint8_t *)
       ((long)_Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
              .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6) = puVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  this->label_bytes_ = this->label_bytes_ + __n;
  *(undefined4 *)
   ((long)_Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar7) = 0;
  return (value_type_conflict3 *)
         ((long)_Var5.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar7);
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        assert(!ptrs_[pos]);

        ++size_;

        uint64_t length = key.length();
        ptrs_[pos] = std::make_unique<uint8_t[]>(length + sizeof(value_type));
        auto ptr = ptrs_[pos].get();
        copy_bytes(ptr, key.begin, length);

        label_bytes_ += length + sizeof(value_type);

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max(max_length_, length);
        sum_length_ += length;
#endif

        auto ret = reinterpret_cast<value_type*>(ptr + length);
        *ret = static_cast<value_type>(0);

        return ret;
    }